

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

int __thiscall
QAccessibleAbstractScrollArea::indexOfChild
          (QAccessibleAbstractScrollArea *this,QAccessibleInterface *child)

{
  long lVar1;
  qsizetype qVar2;
  long *in_RSI;
  long in_FS_OFFSET;
  QObject *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_2c;
  QAccessibleAbstractScrollArea *this_00;
  
  this_00 = *(QAccessibleAbstractScrollArea **)(in_FS_OFFSET + 0x28);
  if (in_RSI != (long *)0x0) {
    lVar1 = (**(code **)(*in_RSI + 0x18))();
    if (lVar1 != 0) {
      accessibleChildren(this_00);
      (**(code **)(*in_RSI + 0x18))();
      qobject_cast<QWidget*>(in_stack_ffffffffffffffa8);
      qVar2 = QListSpecialMethodsBase<QWidget*>::indexOf<QWidget*>
                        ((QListSpecialMethodsBase<QWidget_*> *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (QWidget **)in_stack_ffffffffffffffa8,0x7d5b57);
      local_2c = (int)qVar2;
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7d5b65);
      goto LAB_007d5b65;
    }
  }
  local_2c = -1;
LAB_007d5b65:
  if (*(QAccessibleAbstractScrollArea **)(in_FS_OFFSET + 0x28) == this_00) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleAbstractScrollArea::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object())
        return -1;
    return accessibleChildren().indexOf(qobject_cast<QWidget *>(child->object()));
}